

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void rsg::(anonymous_namespace)::convertValueRange<int,float>
               (int srcMin,int srcMax,float *dstMin,float *dstMax)

{
  float fVar1;
  
  if (srcMin == 0x7fffffff) {
    fVar1 = INFINITY;
  }
  else {
    fVar1 = (float)srcMin;
  }
  *dstMin = fVar1;
  if (srcMax == 0x7fffffff) {
    fVar1 = INFINITY;
  }
  else {
    fVar1 = (float)srcMax;
  }
  *dstMax = fVar1;
  return;
}

Assistant:

inline void convertValueRange (SrcType srcMin, SrcType srcMax, DstType& dstMin, DstType& dstMax)
{
	dstMin = convert<SrcType, DstType>(srcMin);
	dstMax = convert<SrcType, DstType>(srcMax);
}